

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O3

void __thiscall CGameConsole::OnConsoleInit(CGameConsole *this)

{
  IKernel *pIVar1;
  CGameClient *pCVar2;
  IConsole *pIVar3;
  int iVar4;
  undefined4 extraout_var;
  
  (this->m_LocalConsole).m_pGameConsole = this;
  (this->m_RemoteConsole).m_pGameConsole = this;
  pIVar1 = (((this->super_CComponent).m_pClient)->super_IGameClient).super_IInterface.m_pKernel;
  iVar4 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"console");
  this->m_pConsole = (IConsole *)CONCAT44(extraout_var,iVar4);
  pCVar2 = (this->super_CComponent).m_pClient;
  pIVar3 = pCVar2->m_pConsole;
  iVar4 = (*(pIVar3->super_IInterface)._vptr_IInterface[0x17])
                    (pIVar3,(ulong)(uint)pCVar2->m_pConfig->m_ConsoleOutputLevel,
                     ClientConsolePrintCallback,this);
  this->m_PrintCBIndex = iVar4;
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pConsole;
  (*(pIVar3->super_IInterface)._vptr_IInterface[8])
            (pIVar3,"toggle_local_console","",2,ConToggleLocalConsole,this,"Toggle local console");
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pConsole;
  (*(pIVar3->super_IInterface)._vptr_IInterface[8])
            (pIVar3,"toggle_remote_console","",2,ConToggleRemoteConsole,this,"Toggle remote console"
            );
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pConsole;
  (*(pIVar3->super_IInterface)._vptr_IInterface[8])
            (pIVar3,"clear_local_console","",2,ConClearLocalConsole,this,"Clear local console");
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pConsole;
  (*(pIVar3->super_IInterface)._vptr_IInterface[8])
            (pIVar3,"clear_remote_console","",2,ConClearRemoteConsole,this,"Clear remote console");
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pConsole;
  (*(pIVar3->super_IInterface)._vptr_IInterface[8])
            (pIVar3,"dump_local_console","",2,ConDumpLocalConsole,this,
             "Write local console contents to a text file");
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pConsole;
  (*(pIVar3->super_IInterface)._vptr_IInterface[8])
            (pIVar3,"dump_remote_console","",2,ConDumpRemoteConsole,this,
             "Write remote console contents to a text file");
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pConsole;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0xf])
            (pIVar3,"console_output_level",ConchainConsoleOutputLevelUpdate,this);
  return;
}

Assistant:

void CGameConsole::OnConsoleInit()
{
	// init console instances
	m_LocalConsole.Init(this);
	m_RemoteConsole.Init(this);

	m_pConsole = Kernel()->RequestInterface<IConsole>();

	m_PrintCBIndex = Console()->RegisterPrintCallback(Config()->m_ConsoleOutputLevel, ClientConsolePrintCallback, this);

	Console()->Register("toggle_local_console", "", CFGFLAG_CLIENT, ConToggleLocalConsole, this, "Toggle local console");
	Console()->Register("toggle_remote_console", "", CFGFLAG_CLIENT, ConToggleRemoteConsole, this, "Toggle remote console");
	Console()->Register("clear_local_console", "", CFGFLAG_CLIENT, ConClearLocalConsole, this, "Clear local console");
	Console()->Register("clear_remote_console", "", CFGFLAG_CLIENT, ConClearRemoteConsole, this, "Clear remote console");
	Console()->Register("dump_local_console", "", CFGFLAG_CLIENT, ConDumpLocalConsole, this, "Write local console contents to a text file");
	Console()->Register("dump_remote_console", "", CFGFLAG_CLIENT, ConDumpRemoteConsole, this, "Write remote console contents to a text file");

#ifdef CONF_DEBUG
	Console()->Register("dump_commands", "", CFGFLAG_CLIENT, ConDumpCommands, this, "Write list of all commands to a text file");
#endif

	Console()->Chain("console_output_level", ConchainConsoleOutputLevelUpdate, this);
}